

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilDsd.c
# Opt level: O2

int Sdm_ManComputeFunc(Sdm_Man_t *p,int iDsdLit0,int iDsdLit1,int *pCut,int uMask,int fXor)

{
  uint *puVar1;
  uint uVar2;
  Sdm_Dsd_t *pSVar3;
  Vec_Wrd_t *p_00;
  uint uVar4;
  int iVar5;
  int iVar6;
  word wVar7;
  long lVar8;
  byte bVar9;
  uint uVar10;
  int *piVar11;
  uint uVar12;
  word *pwVar13;
  ulong uVar14;
  ulong uVar15;
  uint local_48 [6];
  
  p->nAllDsd = p->nAllDsd + 1;
  if (uMask < 2) {
    __assert_fail("uMask > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilDsd.c"
                  ,0x3a1,"int Sdm_ManComputeFunc(Sdm_Man_t *, int, int, int *, int, int)");
  }
  if (0x4a5 < iDsdLit0) {
    __assert_fail("iDsdLit0 < DSD_CLASS_NUM * 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilDsd.c"
                  ,0x3a2,"int Sdm_ManComputeFunc(Sdm_Man_t *, int, int, int *, int, int)");
  }
  if (0x4a5 < iDsdLit1) {
    __assert_fail("iDsdLit1 < DSD_CLASS_NUM * 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilDsd.c"
                  ,0x3a3,"int Sdm_ManComputeFunc(Sdm_Man_t *, int, int, int *, int, int)");
  }
  pSVar3 = p->pDsd6;
  uVar4 = Abc_Lit2Var(iDsdLit0);
  uVar15 = pSVar3[uVar4].uTruth;
  p_00 = p->vPerm6;
  iVar5 = Abc_Lit2Var(iDsdLit1);
  iVar6 = Vec_IntEntry(p->vMap2Perm,uMask & 0x3ffff);
  wVar7 = Vec_WrdEntry(p_00,iVar5 * 0x2d0 + iVar6);
  if (0x3ffff < (uint)uMask) {
    pwVar13 = s_Truths6;
    for (lVar8 = 0; lVar8 != 6; lVar8 = lVar8 + 1) {
      if ((((uint)uMask >> 0x12) >> ((uint)lVar8 & 0x1f) & 1) != 0) {
        bVar9 = (byte)(1 << ((byte)lVar8 & 0x1f));
        wVar7 = (*pwVar13 & wVar7) >> (bVar9 & 0x3f) | wVar7 << (bVar9 & 0x3f) & *pwVar13;
      }
      pwVar13 = pwVar13 + 1;
    }
  }
  iVar5 = Abc_LitIsCompl(iDsdLit0);
  uVar15 = uVar15 ^ (long)-iVar5;
  iVar5 = Abc_LitIsCompl(iDsdLit1);
  uVar14 = ((long)-iVar5 ^ wVar7) & uVar15;
  if (fXor != 0) {
    uVar14 = (long)-iVar5 ^ wVar7 ^ uVar15;
  }
  uVar4 = Sdm_ManCheckDsd6(p,uVar14);
  if (uVar4 == 0xffffffff) {
    piVar11 = &p->nNonDsd;
    iVar5 = -1;
  }
  else {
    uVar10 = (int)uVar4 >> 0x11;
    if ((int)uVar10 < 0) {
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x12e,"int Abc_Var2Lit(int, int)");
    }
    uVar12 = uVar4 & 0xffff;
    if (0xb3ff < uVar12) {
      __assert_fail("(Config >> 6) < 720",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilDsd.c"
                    ,0x3c8,"int Sdm_ManComputeFunc(Sdm_Man_t *, int, int, int *, int, int)");
    }
    if (pCut != (int *)0x0) {
      local_48[4] = 0xffffffff;
      local_48[5] = 0xffffffff;
      local_48[0] = 0xffffffff;
      local_48[1] = 0xffffffff;
      local_48[2] = 0xffffffff;
      local_48[3] = 0xffffffff;
      uVar2 = *pCut;
      if (6 < (int)uVar2) {
        __assert_fail("pCut[0] <= 6",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilDsd.c"
                      ,0x3cc,"int Sdm_ManComputeFunc(Sdm_Man_t *, int, int, int *, int, int)");
      }
      uVar14 = 0;
      uVar15 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar15 = uVar14;
      }
      for (; uVar15 != uVar14; uVar14 = uVar14 + 1) {
        if (pCut[uVar14 + 1] < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        local_48[p->Perm6[uVar12 >> 6][uVar14]] =
             pCut[uVar14 + 1] ^ (uint)((uVar12 >> ((uint)uVar14 & 0x1f) & 1) != 0);
      }
      uVar12 = p->pDsd6[uVar10].nVars;
      *pCut = uVar12;
      uVar15 = 0;
      uVar14 = (ulong)uVar12;
      if ((int)uVar12 < 1) {
        uVar14 = uVar15;
      }
      while (uVar14 != uVar15) {
        puVar1 = local_48 + uVar15;
        uVar15 = uVar15 + 1;
        if (*puVar1 == 0xffffffff) {
          __assert_fail("pLeavesNew[i] != -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilDsd.c"
                        ,0x3d1,"int Sdm_ManComputeFunc(Sdm_Man_t *, int, int, int *, int, int)");
        }
      }
      for (uVar15 = 0; uVar14 != uVar15; uVar15 = uVar15 + 1) {
        pCut[uVar15 + 1] = local_48[uVar15];
      }
    }
    if (0x252 < (int)uVar10) {
      __assert_fail("iClass < DSD_CLASS_NUM",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilDsd.c"
                    ,0x3d5,"int Sdm_ManComputeFunc(Sdm_Man_t *, int, int, int *, int, int)");
    }
    iVar5 = (uVar4 >> 0x10 & 1) + uVar10 * 2;
    piVar11 = p->nCountDsd + uVar10;
  }
  *piVar11 = *piVar11 + 1;
  return iVar5;
}

Assistant:

int Sdm_ManComputeFunc( Sdm_Man_t * p, int iDsdLit0, int iDsdLit1, int * pCut, int uMask, int fXor )
{
//    int fVerbose = 0;
    int i, Config, iClass, fCompl, Res;
    int PermMask = uMask & 0x3FFFF;
    int ComplMask = uMask >> 18;
    word Truth0, Truth1p, t0, t1, t;
    p->nAllDsd++;

    assert( uMask > 1 );
    assert( iDsdLit0 < DSD_CLASS_NUM * 2 );
    assert( iDsdLit1 < DSD_CLASS_NUM * 2 );
    Truth0  = p->pDsd6[Abc_Lit2Var(iDsdLit0)].uTruth;
    Truth1p = Vec_WrdEntry( p->vPerm6, Abc_Lit2Var(iDsdLit1) * 720 + Vec_IntEntry(p->vMap2Perm, PermMask ) );
    if ( ComplMask )
        for ( i = 0; i < 6; i++ )
            if ( (ComplMask >> i) & 1 )
                Truth1p = Abc_Tt6Flip( Truth1p, i );            
    t0 = Abc_LitIsCompl(iDsdLit0) ? ~Truth0  : Truth0;
    t1 = Abc_LitIsCompl(iDsdLit1) ? ~Truth1p : Truth1p;
    t = fXor ? t0 ^ t1 : t0 & t1;
/*
if ( fVerbose )
{
Sdm_ManPrintPerm( PermMask );                      printf( "\n" );
Extra_PrintBinary( stdout, &ComplMask, 6 );        printf( "\n" );
Kit_DsdPrintFromTruth( (unsigned *)&Truth0, 6 );   printf( "\n" );
Kit_DsdPrintFromTruth( (unsigned *)&Truth1p, 6 );  printf( "\n" );
Kit_DsdPrintFromTruth( (unsigned *)&t, 6 );        printf( "\n" );
}
*/
    // find configuration
    Config = Sdm_ManCheckDsd6( p, t );
    if ( Config == -1 )
    {
        p->nNonDsd++;
        return -1;
    }

    // get the class
    iClass = Config >> 17;
    fCompl = (Config >> 16) & 1;
    Config &= 0xFFFF;

    // set the function
    Res = Abc_Var2Lit( iClass, fCompl );

    // update cut
    assert( (Config >> 6) < 720 );
    if ( pCut )
    {
        int pLeavesNew[6] = { -1, -1, -1, -1, -1, -1 };
        assert( pCut[0] <= 6 );
        for ( i = 0; i < pCut[0]; i++ )
            pLeavesNew[(int)(p->Perm6[Config >> 6][i])] = Abc_LitNotCond( pCut[i+1], (Config >> i) & 1 );
        pCut[0] = p->pDsd6[iClass].nVars;
        for ( i = 0; i < pCut[0]; i++ )
            assert( pLeavesNew[i] != -1 );
        for ( i = 0; i < pCut[0]; i++ )
            pCut[i+1] = pLeavesNew[i];
    }
    assert( iClass < DSD_CLASS_NUM );
    p->nCountDsd[iClass]++;
    return Res;
}